

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000006b0480 = 0x2e2e2e2e2e2e2e;
    uRam00000000006b0487._0_1_ = '.';
    uRam00000000006b0487._1_1_ = '.';
    uRam00000000006b0487._2_1_ = '.';
    uRam00000000006b0487._3_1_ = '.';
    uRam00000000006b0487._4_1_ = '.';
    uRam00000000006b0487._5_1_ = '.';
    uRam00000000006b0487._6_1_ = '.';
    uRam00000000006b0487._7_1_ = '.';
    DAT_006b0470 = '.';
    DAT_006b0470_1._0_1_ = '.';
    DAT_006b0470_1._1_1_ = '.';
    DAT_006b0470_1._2_1_ = '.';
    DAT_006b0470_1._3_1_ = '.';
    DAT_006b0470_1._4_1_ = '.';
    DAT_006b0470_1._5_1_ = '.';
    DAT_006b0470_1._6_1_ = '.';
    uRam00000000006b0478 = 0x2e2e2e2e2e2e2e;
    DAT_006b047f = 0x2e;
    DAT_006b0460 = '.';
    DAT_006b0460_1._0_1_ = '.';
    DAT_006b0460_1._1_1_ = '.';
    DAT_006b0460_1._2_1_ = '.';
    DAT_006b0460_1._3_1_ = '.';
    DAT_006b0460_1._4_1_ = '.';
    DAT_006b0460_1._5_1_ = '.';
    DAT_006b0460_1._6_1_ = '.';
    uRam00000000006b0468._0_1_ = '.';
    uRam00000000006b0468._1_1_ = '.';
    uRam00000000006b0468._2_1_ = '.';
    uRam00000000006b0468._3_1_ = '.';
    uRam00000000006b0468._4_1_ = '.';
    uRam00000000006b0468._5_1_ = '.';
    uRam00000000006b0468._6_1_ = '.';
    uRam00000000006b0468._7_1_ = '.';
    DAT_006b0450 = '.';
    DAT_006b0450_1._0_1_ = '.';
    DAT_006b0450_1._1_1_ = '.';
    DAT_006b0450_1._2_1_ = '.';
    DAT_006b0450_1._3_1_ = '.';
    DAT_006b0450_1._4_1_ = '.';
    DAT_006b0450_1._5_1_ = '.';
    DAT_006b0450_1._6_1_ = '.';
    uRam00000000006b0458._0_1_ = '.';
    uRam00000000006b0458._1_1_ = '.';
    uRam00000000006b0458._2_1_ = '.';
    uRam00000000006b0458._3_1_ = '.';
    uRam00000000006b0458._4_1_ = '.';
    uRam00000000006b0458._5_1_ = '.';
    uRam00000000006b0458._6_1_ = '.';
    uRam00000000006b0458._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000006b0448._0_1_ = '.';
    uRam00000000006b0448._1_1_ = '.';
    uRam00000000006b0448._2_1_ = '.';
    uRam00000000006b0448._3_1_ = '.';
    uRam00000000006b0448._4_1_ = '.';
    uRam00000000006b0448._5_1_ = '.';
    uRam00000000006b0448._6_1_ = '.';
    uRam00000000006b0448._7_1_ = '.';
    DAT_006b048f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const &_name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
  }